

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Calli(w3Interp *this)

{
  w3Module *pwVar1;
  pointer pwVar2;
  pointer pwVar3;
  ulong uVar4;
  bool bVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  w3FunctionType *this_00;
  
  uVar6 = w3Stack::pop_u32(&this->super_w3Stack);
  uVar8 = (ulong)uVar6;
  pwVar1 = this->module;
  pwVar2 = (pwVar1->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(pwVar1->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pwVar2) / 0x28) <= uVar8) {
    AssertFailed("function_index < module->functions.size ()");
  }
  uVar9 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  pwVar3 = (pwVar1->function_types).
           super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = ((long)(pwVar1->function_types).
                 super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pwVar3) / 0x30;
  if (uVar7 <= uVar9) {
    AssertFailed("type_index1 < module->function_types.size ()");
  }
  uVar4 = pwVar2[uVar8].function_type_index;
  if (uVar7 <= uVar4) {
    AssertFailed("type_index2 < module->function_types.size ()");
  }
  this_00 = pwVar3 + uVar9;
  if (uVar4 != uVar9) {
    bVar5 = w3FunctionType::operator==(this_00,pwVar3 + uVar4);
    if (!bVar5) {
      AssertFailed("type_index2 == type_index1 || *type1 == *type2");
    }
  }
  if ((ulong)((long)(this_00->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this_00->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                   super__Vector_impl_data._M_start) < 2) {
    Invoke(this,pwVar2 + uVar8);
    return;
  }
  AssertFailed("type1->results.size () <= 1");
}

Assistant:

INTERP (Calli)
{
    // TODO signed or unsigned
    // call is unsigned
    const size_t function_index = pop_u32 ();

    const size_t type_index1 = instr->u32;

    // This seems like it could be validated earlier.
    Assert (function_index < module->functions.size ());

    w3Function& function = module->functions [function_index];

    const size_t type_index2 = function.function_type_index;

    Assert (type_index1 < module->function_types.size ());
    Assert (type_index2 < module->function_types.size ());

    const w3FunctionType* type1 = &module->function_types [type_index1];
    const w3FunctionType* type2 = &module->function_types [type_index2];

    Assert (type_index2 == type_index1 || *type1 == *type2);

    Assert (type1->results.size () <= 1); // future

    Invoke (function);
}